

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O2

ENUM__mathml__display
COLLADASaxFWL15::toEnum_ENUM__mathml__display
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__display> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  StringHash SVar1;
  
  SVar1 = (*baseConversionFunc)(buffer,bufferEnd,failed);
  if (enumMap->first != SVar1) {
    if (enumMap[1].first != SVar1) {
      *failed = true;
      return ENUM__mathml__display__COUNT;
    }
    enumMap = enumMap + 1;
  }
  *failed = false;
  return enumMap->second;
}

Assistant:

ENUM__mathml__display toEnum_ENUM__mathml__display (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__mathml__display>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__mathml__display, StringHash, ENUM__mathml__display__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}